

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

int proxy_log_select_medium(proxy_handle *ph,LOG_MEDIUM medium,char *target)

{
  void *pvVar1;
  int iVar2;
  int ret;
  proxy_priv *priv;
  char *target_local;
  LOG_MEDIUM medium_local;
  proxy_handle *ph_local;
  
  pvVar1 = ph->priv;
  iVar2 = log_select_medium((log_handle *)((long)pvVar1 + 0x860),medium,target);
  if ((medium != LOG_MEDIUM_NONE) && (iVar2 == 0)) {
    log_ident((log_handle *)((long)pvVar1 + 0x860));
  }
  return iVar2;
}

Assistant:

int proxy_log_select_medium(struct proxy_handle *ph, enum LOG_MEDIUM medium,
			    const char *target)
{
	struct proxy_priv *priv = ph->priv;
	int ret;

	ret = log_select_medium(&priv->log, medium, target);
	if (medium != LOG_MEDIUM_NONE && ret == 0)
		log_ident(&priv->log);

	return ret;
}